

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseFrexp::test(ShaderBitfieldOperationCaseFrexp *this,Data *data)

{
  bool bVar1;
  GLint __exponent;
  long lVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  
  if (this->m_components < 1) {
    bVar1 = true;
  }
  else {
    lVar2 = 0;
    do {
      fVar5 = data->outVec4[lVar2];
      if ((data->inVec4[lVar2] != 0.0) || (NAN(data->inVec4[lVar2]))) {
        uVar3 = -(uint)(-fVar5 <= fVar5);
        fVar4 = (float)(~uVar3 & (uint)-fVar5 | uVar3 & (uint)fVar5);
        __exponent = 0;
        if ((fVar4 < 0.5) || (1.0 <= fVar4)) goto LAB_00befccd;
        __exponent = data->outIvec4[lVar2];
      }
      else {
        __exponent = 0;
        if (((fVar5 != 0.0) || (NAN(fVar5))) || (data->outIvec4[lVar2] != 0)) goto LAB_00befccd;
      }
      fVar4 = ldexpf(1.0,__exponent);
      fVar5 = fVar5 * fVar4 - data->inVec4[lVar2];
      uVar3 = -(uint)(-fVar5 <= fVar5);
      if (0.0001 < (float)(~uVar3 & (uint)-fVar5 | (uint)fVar5 & uVar3)) {
        __exponent = 0;
        goto LAB_00befccd;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->m_components);
    __exponent = 1;
LAB_00befccd:
    bVar1 = SUB41(__exponent,0);
  }
  return bVar1;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			if (data->inVec4[i] == 0.0)
			{
				if (data->outVec4[i] != 0.0 || data->outIvec4[i] != 0)
				{
					return false;
				}
			}
			else if (deFloatAbs(data->outVec4[i]) < 0.5 || deFloatAbs(data->outVec4[i]) >= 1.0)
			{
				return false;
			}

			float result = data->outVec4[i] * deFloatPow(2.0, (float)data->outIvec4[i]);
			if (deFloatAbs(result - data->inVec4[i]) > 0.0001f)
			{
				return false;
			}
		}
		return true;
	}